

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void worker_error(worker_thread *thr,lzma_ret ret)

{
  lzma_stream_coder_conflict1 *plVar1;
  
  if (ret == LZMA_STREAM_END) {
    __assert_fail("ret != LZMA_STREAM_END",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xb9,"void worker_error(worker_thread *, lzma_ret)");
  }
  if (ret != LZMA_OK) {
    mythread_mutex_lock(&thr->coder->mutex);
    plVar1 = thr->coder;
    if (plVar1->thread_error == LZMA_OK) {
      plVar1->thread_error = ret;
    }
    mythread_cond_signal(&plVar1->cond);
    mythread_mutex_unlock(&thr->coder->mutex);
    return;
  }
  __assert_fail("ret != LZMA_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                ,0xb8,"void worker_error(worker_thread *, lzma_ret)");
}

Assistant:

static void
worker_error(worker_thread *thr, lzma_ret ret)
{
	assert(ret != LZMA_OK);
	assert(ret != LZMA_STREAM_END);

	mythread_sync(thr->coder->mutex) {
		if (thr->coder->thread_error == LZMA_OK)
			thr->coder->thread_error = ret;

		mythread_cond_signal(&thr->coder->cond);
	}

	return;
}